

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

void __thiscall
flow::CallInstr::CallInstr
          (CallInstr *this,IRBuiltinFunction *callee,
          vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args,string *name)

{
  LiteralType ty;
  Signature *pSVar1;
  string *vec;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_50;
  IRBuiltinFunction *local_38;
  
  vec = name;
  local_38 = callee;
  pSVar1 = IRBuiltinFunction::signature(callee);
  ty = pSVar1->returnType_;
  join<flow::IRBuiltinFunction*,flow::Value*>
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_50,(flow *)&local_38,
             (IRBuiltinFunction **)args,(vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)vec
            );
  Instr::Instr(&this->super_Instr,ty,
               (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_50,name);
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_50);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_0019c1d8;
  return;
}

Assistant:

CallInstr::CallInstr(IRBuiltinFunction* callee, const std::vector<Value*>& args,
                     const std::string& name)
    : Instr(callee->signature().returnType(), join(callee, args), name) {}